

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::check_token(parser *this)

{
  bool bVar1;
  token_type tVar2;
  token *t;
  wostream *pwVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  token_type t_00;
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  wstring local_3e8;
  token local_3c8;
  wstring local_3a0 [32];
  undefined1 local_380 [16];
  source_extend local_370;
  wostringstream local_358 [8];
  wostringstream _oss_1;
  wstring local_1e0 [32];
  undefined1 local_1c0 [16];
  source_extend local_1b0;
  wostringstream local_188 [8];
  wostringstream _oss;
  parser *this_local;
  
  t = lexer::current_token(&this->lexer_);
  token::operator=(&this->current_token_,t);
  tVar2 = current_token_type(this);
  bVar1 = is_reserved(tVar2,this->version_);
  if (bVar1) {
    std::__cxx11::wostringstream::wostringstream(local_188);
    tVar2 = current_token_type(this);
    pwVar3 = mjs::operator<<((wostream *)local_188,tVar2);
    pwVar3 = std::operator<<(pwVar3," is reserved in ");
    mjs::operator<<(pwVar3,this->version_);
    current_extend(&local_1b0,this);
    std::__cxx11::wostringstream::str();
    local_1c0 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1e0);
    message._M_str = in_R9;
    message._M_len = local_1c0._8_8_;
    syntax_error((parser *)"check_token",(char *)0x160,(int)&local_1b0,local_1c0._0_8_,message);
  }
  if (1 < (int)this->version_) {
    tVar2 = current_token_type(this);
    bVar1 = find_token<9ul>(tVar2,(token_type (*) [9])es5_strict_reserved_tokens);
    if (bVar1) {
      if ((this->strict_mode_ & 1U) != 0) {
        std::__cxx11::wostringstream::wostringstream(local_358);
        tVar2 = current_token_type(this);
        pwVar3 = mjs::operator<<((wostream *)local_358,tVar2);
        pwVar3 = std::operator<<(pwVar3," is reserved in ");
        pbVar4 = mjs::operator<<(pwVar3,this->version_);
        std::operator<<(pbVar4," strict mode");
        current_extend(&local_370,this);
        std::__cxx11::wostringstream::str();
        local_380 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_3a0);
        message_00._M_str = in_R9;
        message_00._M_len = local_380._8_8_;
        syntax_error((parser *)"check_token",(char *)0x163,(int)&local_370,local_380._0_8_,
                     message_00);
      }
      tVar2 = current_token_type(this);
      token_string_abi_cxx11_(&local_3e8,(mjs *)(ulong)tVar2,t_00);
      token::token(&local_3c8,identifier,&local_3e8);
      token::operator=(&this->current_token_,&local_3c8);
      token::~token(&local_3c8);
      std::__cxx11::wstring::~wstring((wstring *)&local_3e8);
    }
  }
  return;
}

Assistant:

void check_token() {
        current_token_ = lexer_.current_token();
        if (is_reserved(current_token_type(), version_)) {
            SYNTAX_ERROR(current_token_type() << " is reserved in " << version_);
        } else if (version_ >= version::es5 && find_token(current_token_type(), es5_strict_reserved_tokens)) {
            if (strict_mode_) {
                SYNTAX_ERROR(current_token_type() << " is reserved in " << version_ << " strict mode");
            }
            current_token_ = token{token_type::identifier, token_string(current_token_type())};
        }
    }